

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinAsciiLower
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  value_type vVar1;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  const_reference pvVar2;
  size_type sVar3;
  reference pvVar4;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *in_RDX;
  long in_RDI;
  Value VVar5;
  size_t i;
  UString new_str;
  HeapString *str;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *in_stack_000001c0;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_stack_000001c8;
  string *in_stack_000001d0;
  LocationRange *in_stack_000001d8;
  Interpreter *in_stack_000001e0;
  UString *in_stack_fffffffffffffed8;
  Interpreter *in_stack_fffffffffffffee0;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *in_stack_fffffffffffffef0;
  allocator_type *in_stack_ffffffffffffff08;
  allocator<char> *in_stack_ffffffffffffff10;
  ulong uVar6;
  char *in_stack_ffffffffffffff18;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *this_00;
  undefined4 uStack_bc;
  ulong local_b0;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_a8;
  anon_union_8_3_4e909c26_for_v local_88;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_7d [2];
  allocator<char> local_39;
  string local_38 [32];
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *local_18;
  
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  local_7d[0]._M_dataplus._M_p._1_4_ = 0x13;
  local_7d[0]._5_8_ = (long)&local_7d[0]._M_dataplus._M_p + 1;
  local_7d[0]._13_8_ = 1;
  this_00 = local_7d;
  __str = local_18;
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x22dc1c);
  __l._M_len = (size_type)this_00;
  __l._M_array = (iterator)__str;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)in_stack_ffffffffffffff10,__l,in_stack_ffffffffffffff08);
  validateBuiltinArgs(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0,in_stack_000001c8,
                      in_stack_000001c0);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~vector(in_stack_fffffffffffffef0);
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::~allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x22dc80);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  pvVar2 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                         *)local_18,0);
  local_88 = pvVar2->v;
  std::__cxx11::u32string::u32string(this_00,__str);
  local_b0 = 0;
  while( true ) {
    uVar6 = local_b0;
    sVar3 = std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::size
                      (&local_a8);
    if (sVar3 <= uVar6) break;
    pvVar4 = std::__cxx11::
             basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
             operator[]((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                         *)in_stack_fffffffffffffee0,(size_type)in_stack_fffffffffffffed8);
    if (0x40 < (uint)*pvVar4) {
      pvVar4 = std::__cxx11::
               basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
               operator[]((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                           *)in_stack_fffffffffffffee0,(size_type)in_stack_fffffffffffffed8);
      if ((uint)*pvVar4 < 0x5b) {
        pvVar4 = std::__cxx11::
                 basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
                 operator[]((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                             *)in_stack_fffffffffffffee0,(size_type)in_stack_fffffffffffffed8);
        vVar1 = *pvVar4;
        pvVar4 = std::__cxx11::
                 basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
                 operator[]((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                             *)in_stack_fffffffffffffee0,(size_type)in_stack_fffffffffffffed8);
        *pvVar4 = vVar1 + L' ';
      }
    }
    local_b0 = local_b0 + 1;
  }
  VVar5 = makeString(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  *(ulong *)(in_RDI + 0x40) = CONCAT44(uStack_bc,VVar5.t);
  ((anon_union_8_3_4e909c26_for_v *)(in_RDI + 0x48))->h = (HeapEntity *)VVar5.v;
  std::__cxx11::u32string::~u32string
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             VVar5.v.h);
  return (AST *)0x0;
}

Assistant:

const AST *builtinAsciiLower(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "asciiLower", args, {Value::STRING});
        const auto *str = static_cast<const HeapString *>(args[0].v.h);
        UString new_str(str->value);
        for (size_t i = 0; i < new_str.size(); ++i) {
            if (new_str[i] >= 'A' && new_str[i] <= 'Z') {
                new_str[i] = new_str[i] - 'A' + 'a';
            }
        }
        scratch = makeString(new_str);
        return nullptr;
    }